

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

string * __thiscall
cppcms::rpc::json_rpc_server::method_abi_cxx11_
          (string *__return_storage_ptr__,json_rpc_server *this)

{
  check_call(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->current_call_).
               super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              method_);
  return __return_storage_ptr__;
}

Assistant:

std::string json_rpc_server::method()
	{
		check_call();
		return current_call_->method();
	}